

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svggeometryelement.cpp
# Opt level: O3

Rect __thiscall lunasvg::SVGRectElement::updateShape(SVGRectElement *this,Path *path)

{
  float w;
  float h;
  float x;
  float y;
  float fVar1;
  float fVar2;
  float fVar3;
  Rect RVar4;
  LengthContext lengthContext;
  LengthContext local_28;
  
  local_28.m_units = UserSpaceOnUse;
  local_28.m_element = (SVGElement *)this;
  w = LengthContext::valueForLength
                (&local_28,(Length *)&(this->m_width).super_SVGProperty.field_0xc,
                 (this->m_width).super_SVGProperty.field_0x9);
  h = LengthContext::valueForLength
                (&local_28,(Length *)&(this->m_height).super_SVGProperty.field_0xc,
                 (this->m_height).super_SVGProperty.field_0x9);
  if ((w <= 0.0) || (h <= 0.0)) {
    x = 0.0;
    y = 0.0;
    w = 0.0;
    h = 0.0;
  }
  else {
    x = LengthContext::valueForLength
                  (&local_28,(Length *)&(this->m_x).super_SVGProperty.field_0xc,
                   (this->m_x).super_SVGProperty.field_0x9);
    y = LengthContext::valueForLength
                  (&local_28,(Length *)&(this->m_y).super_SVGProperty.field_0xc,
                   (this->m_y).super_SVGProperty.field_0x9);
    fVar1 = LengthContext::valueForLength
                      (&local_28,(Length *)&(this->m_rx).super_SVGProperty.field_0xc,
                       (this->m_rx).super_SVGProperty.field_0x9);
    fVar2 = LengthContext::valueForLength
                      (&local_28,(Length *)&(this->m_ry).super_SVGProperty.field_0xc,
                       (this->m_ry).super_SVGProperty.field_0x9);
    fVar3 = (float)(~-(uint)(0.0 < fVar1) & (uint)fVar2 | (uint)fVar1 & -(uint)(0.0 < fVar1));
    fVar2 = (float)(-(uint)(0.0 < fVar2) & (uint)fVar2 | ~-(uint)(0.0 < fVar2) & (uint)fVar3);
    fVar1 = w * 0.5;
    if (fVar3 <= w * 0.5) {
      fVar1 = fVar3;
    }
    fVar3 = h * 0.5;
    if (fVar2 <= h * 0.5) {
      fVar3 = fVar2;
    }
    Path::addRoundRect(path,x,y,w,h,fVar1,fVar3);
  }
  RVar4.y = y;
  RVar4.x = x;
  RVar4.h = h;
  RVar4.w = w;
  return RVar4;
}

Assistant:

Rect SVGRectElement::updateShape(Path& path)
{
    LengthContext lengthContext(this);
    auto width = lengthContext.valueForLength(m_width);
    auto height = lengthContext.valueForLength(m_height);
    if(width <= 0.f || height <= 0.f) {
        return Rect::Empty;
    }

    auto x = lengthContext.valueForLength(m_x);
    auto y = lengthContext.valueForLength(m_y);

    auto rx = lengthContext.valueForLength(m_rx);
    auto ry = lengthContext.valueForLength(m_ry);

    if(rx <= 0.f) rx = ry;
    if(ry <= 0.f) ry = rx;

    rx = std::min(rx, width / 2.f);
    ry = std::min(ry, height / 2.f);

    path.addRoundRect(x, y, width, height, rx, ry);
    return Rect(x, y, width, height);
}